

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_stream.cpp
# Opt level: O0

bool __thiscall StreamSong::IsPlaying(StreamSong *this)

{
  uint uVar1;
  StreamSong *this_local;
  
  if ((this->super_MusInfo).m_Status == STATE_Stopped) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*this->m_Stream->_vptr_SoundStream[7])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      (*(this->super_MusInfo)._vptr_MusInfo[7])();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StreamSong::IsPlaying ()
{
	if (m_Status != STATE_Stopped)
	{
		if (m_Stream->IsEnded())
		{
			Stop();
			return false;
		}
		return true;
	}
	return false;
}